

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_pipe_fini(void *arg)

{
  _Bool _Var1;
  int iVar2;
  nni_msg *local_20;
  nng_msg *m;
  udp_pipe *p;
  void *arg_local;
  
  m = (nng_msg *)arg;
  p = (udp_pipe *)arg;
  while( true ) {
    _Var1 = nni_lmq_empty((nni_lmq *)((long)&m->m_addr + 0x70));
    if (((_Var1 ^ 0xffU) & 1) == 0) break;
    nni_lmq_get((nni_lmq *)((long)&m->m_addr + 0x70),&local_20);
    nni_msg_free(local_20);
  }
  nni_lmq_fini((nni_lmq *)((long)&m->m_addr + 0x70));
  iVar2 = nni_list_empty((nni_list *)(m[1].m_header_buf + 0xc));
  if (iVar2 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,0x14a,"nni_list_empty(&p->rx_aios)");
  }
  return;
}

Assistant:

static void
udp_pipe_fini(void *arg)
{
	udp_pipe *p = arg;
	nng_msg  *m;

	// call with ep->mtx lock held
	while (!nni_lmq_empty(&p->rx_mq)) {
		nni_lmq_get(&p->rx_mq, &m);
		nni_msg_free(m);
	}
	nni_lmq_fini(&p->rx_mq);
	NNI_ASSERT(nni_list_empty(&p->rx_aios));
}